

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::DecompressPiz
               (uchar *outPtr,uchar *inPtr,size_t tmpBufSize,int num_channels,
               EXRChannelInfo *channels,int data_width,int num_lines)

{
  pointer pPVar1;
  long *plVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  unsigned_short *puVar6;
  size_t __n;
  ulong uVar7;
  unsigned_short uVar8;
  ushort uVar9;
  short sVar10;
  uint uVar11;
  reference pvVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  long lVar17;
  long lVar18;
  size_t sVar19;
  uint uVar20;
  long lVar22;
  ushort uVar23;
  int *piVar24;
  ushort *puVar25;
  ushort *puVar26;
  size_t i;
  short hs;
  ushort uVar27;
  uchar *puVar28;
  size_type __n_00;
  ushort uVar29;
  bool bVar30;
  allocator_type aStack_22109;
  ulong uStack_22108;
  ushort *puStack_22100;
  uint uStack_220f4;
  int iStack_220f0;
  uint uStack_220ec;
  uchar *puStack_220e8;
  long lStack_220e0;
  ulong uStack_220d8;
  size_t sStack_220d0;
  long lStack_220c8;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  uchar bitmap [8192];
  unsigned_short lut [65536];
  ulong uVar21;
  
  sStack_220d0 = tmpBufSize;
  memset(bitmap,0,0x2000);
  uVar3 = *(ushort *)(inPtr + 2);
  if ((ulong)uVar3 < 0x2000) {
    uVar9 = *(ushort *)inPtr;
    puVar28 = inPtr + 4;
    uStack_22108 = CONCAT44(uStack_22108._4_4_,num_channels);
    puStack_220e8 = outPtr;
    if (uVar9 <= uVar3) {
      lVar18 = (ulong)uVar3 - (ulong)uVar9;
      memcpy(bitmap + uVar9,puVar28,lVar18 + 1);
      puVar28 = puVar28 + lVar18 + 1;
    }
    memset(lut,0,0x20000);
    uVar8 = reverseLutFromBitmap(bitmap,lut);
    sVar19 = sStack_220d0;
    puStack_22100 = (ushort *)CONCAT44(puStack_22100._4_4_,*(undefined4 *)puVar28);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&tmpBuffer,sStack_220d0,(allocator_type *)&channelData);
    pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
    hufUncompress((char *)(puVar28 + 4),(int)puStack_22100,pvVar12,(int)sVar19);
    __n_00 = (size_type)(int)uStack_22108;
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&channelData,__n_00,&aStack_22109);
    pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
    piVar16 = &(channelData.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start)->size;
    piVar24 = &channels->pixel_type;
    while (bVar30 = __n_00 != 0, __n_00 = __n_00 - 1, bVar30) {
      iVar4 = *piVar24;
      ((PIZChannelData *)(piVar16 + -7))->start = pvVar12;
      *(reference *)(piVar16 + -5) = pvVar12;
      piVar16[-3] = data_width;
      piVar16[-2] = num_lines;
      *piVar16 = (iVar4 != 1) + 1;
      pvVar12 = pvVar12 + (num_lines * data_width << (iVar4 != 1));
      piVar16 = piVar16 + 8;
      piVar24 = piVar24 + 0x44;
    }
    for (lVar18 = 0;
        lVar18 != (long)channelData.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)channelData.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5; lVar18 = lVar18 + 1) {
      pPVar1 = channelData.
               super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar18;
      uStack_220f4 = channelData.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar18].size;
      uVar15 = 0;
      if (0 < (int)uStack_220f4) {
        uVar15 = (ulong)uStack_220f4;
      }
      lStack_220e0 = 0;
      uVar7 = 0;
      while (uVar13 = uVar7, uVar13 != uVar15) {
        puVar6 = pPVar1->start;
        uVar5 = pPVar1->nx;
        uStack_220ec = pPVar1->ny;
        uVar11 = uStack_220ec;
        if ((int)uVar5 < (int)uStack_220ec) {
          uVar11 = uVar5;
        }
        iVar4 = 1;
        do {
          iVar14 = iVar4;
          iVar4 = iVar14 * 2;
        } while (iVar14 <= (int)uVar11);
        iStack_220f0 = uVar5 * uStack_220f4;
        uVar7 = (ulong)(uint)(iVar14 >> 2);
        uVar11 = iVar14 >> 1;
        while (uVar21 = uVar7, uVar20 = (uint)uVar21, 0 < (int)uVar20) {
          lStack_220c8 = (long)(int)((uVar5 - uVar11) * uStack_220f4);
          lVar22 = (long)(int)(uVar20 * uStack_220f4);
          lVar17 = (long)(int)(uVar20 * iStack_220f0);
          puVar25 = (ushort *)((long)puVar6 + lStack_220e0);
          while (puVar26 = puVar25,
                puVar26 <= puVar6 + uVar13 + (long)(int)((uStack_220ec - uVar11) * iStack_220f0)) {
            for (puVar25 = puVar26; puVar25 <= puVar26 + lStack_220c8;
                puVar25 = puVar25 + (int)(uVar11 * uStack_220f4)) {
              uVar9 = puVar25[lVar17];
              if (uVar8 < 0x4000) {
                sVar10 = ((short)uVar9 >> 1) + *puVar25 + (uVar9 & 1);
                uVar29 = puVar25[lVar22 + lVar17];
                uVar23 = ((short)uVar29 >> 1) + (uVar29 & 1) + puVar25[lVar22];
                uVar27 = ((short)uVar23 >> 1) + (uVar23 & 1) + sVar10;
                *puVar25 = uVar27;
                uVar29 = uVar23 - uVar29;
                puVar25[lVar22] = uVar27 - uVar23;
                uVar9 = ((short)uVar29 >> 1) + (uVar29 & 1) + (sVar10 - uVar9);
                puVar25[lVar17] = uVar9;
                puVar25[lVar22 + lVar17] = uVar9 - uVar29;
              }
              else {
                sVar10 = *puVar25 - (uVar9 >> 1);
                uVar23 = puVar25[lVar22] - (puVar25[lVar22 + lVar17] >> 1);
                uVar29 = puVar25[lVar22 + lVar17] + uVar23 ^ 0x8000;
                uVar9 = (sVar10 + uVar9 ^ 0x8000) - (uVar29 >> 1);
                puVar25[lVar22] = uVar9;
                *puVar25 = uVar9 + uVar29 ^ 0x8000;
                uVar9 = sVar10 - (uVar23 >> 1);
                puVar25[lVar22 + lVar17] = uVar9;
                puVar25[lVar17] = uVar9 + uVar23 ^ 0x8000;
              }
            }
            if ((uVar5 & uVar20) != 0) {
              uVar9 = puVar25[lVar17];
              if (uVar8 < 0x4000) {
                uVar23 = ((short)uVar9 >> 1) + *puVar25 + (uVar9 & 1);
                uVar29 = uVar23 - uVar9;
              }
              else {
                uVar29 = *puVar25 - (uVar9 >> 1);
                uVar23 = uVar29 + uVar9 ^ 0x8000;
              }
              puVar25[lVar17] = uVar29;
              *puVar25 = uVar23;
            }
            puStack_22100 = puVar26;
            puVar25 = puVar26 + (int)(uVar11 * iStack_220f0);
          }
          if ((uVar20 & uStack_220ec) != 0) {
            puVar25 = puVar26 + lStack_220c8;
            for (; puVar26 <= puVar25; puVar26 = puVar26 + (int)(uVar11 * uStack_220f4)) {
              uVar9 = puVar26[lVar22];
              if (uVar8 < 0x4000) {
                uVar23 = ((short)uVar9 >> 1) + *puVar26 + (uVar9 & 1);
                uVar29 = uVar23 - uVar9;
              }
              else {
                uVar29 = *puVar26 - (uVar9 >> 1);
                uVar23 = uVar29 + uVar9 ^ 0x8000;
              }
              puVar26[lVar22] = uVar29;
              *puVar26 = uVar23;
            }
          }
          sVar19 = sStack_220d0;
          uVar11 = uVar20;
          uStack_22108 = uVar21;
          uVar7 = uVar21 >> 1;
        }
        lStack_220e0 = lStack_220e0 + 2;
        uStack_220d8 = uVar13;
        uVar7 = uVar13 + 1;
      }
    }
    puVar25 = (ushort *)0x0;
    pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
    applyLut(lut,pvVar12,(int)sVar19);
    if (num_lines < 1) {
      num_lines = 0;
    }
    uStack_22108 = CONCAT44(uStack_22108._4_4_,num_lines);
    while ((int)puVar25 != (int)uStack_22108) {
      lVar18 = 8;
      puStack_22100 = puVar25;
      for (uVar15 = 0;
          pPVar1 = channelData.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start, puVar28 = puStack_220e8,
          uVar15 < (ulong)((long)channelData.
                                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)channelData.
                                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar15 = uVar15 + 1) {
        lVar17 = (long)*(int *)((long)&(channelData.
                                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ny + lVar18) *
                 (long)*(int *)((long)&(channelData.
                                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->end + lVar18);
        __n = lVar17 * 2;
        memcpy(puStack_220e8,
               *(void **)((long)&(channelData.
                                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->start + lVar18),__n);
        plVar2 = (long *)((long)&pPVar1->start + lVar18);
        *plVar2 = *plVar2 + __n;
        puStack_220e8 = puVar28 + lVar17 * 2;
        lVar18 = lVar18 + 0x20;
      }
      puVar25 = (ushort *)(ulong)((int)puStack_22100 + 1);
    }
    std::_Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
    ~_Vector_base(&channelData.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 );
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  return uVar3 < 0x2000;
}

Assistant:

bool DecompressPiz(unsigned char *outPtr, const unsigned char *inPtr,
                   size_t tmpBufSize, int num_channels,
                   const EXRChannelInfo *channels, int data_width,
                   int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  memset(bitmap, 0, BITMAP_SIZE);

  const unsigned char *ptr = inPtr;
  minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  if (minNonZero <= maxNonZero) {
    memcpy((char *)&bitmap[0] + minNonZero, ptr, maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
  }

  unsigned short lut[USHORT_RANGE];
  memset(lut, 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap, lut);

  //
  // Huffman decoding
  //

  int length;

  length = *(reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  std::vector<unsigned short> tmpBuffer(tmpBufSize);
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer.at(0),
                tmpBufSize);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(num_channels);

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < static_cast<size_t>(num_channels); ++i) {
    const EXRChannelInfo &chan = channels[i];

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (chan.pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = data_width;
    channelData[i].ny = num_lines;
    // channelData[i].ys = 1;
    channelData[i].size = pixelSize / sizeof(short);

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut, &tmpBuffer.at(0), tmpBufSize);

  for (int y = 0; y < num_lines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(outPtr, cd.end, n * sizeof(unsigned short));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}